

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ReusableStringStream * __thiscall
Catch::ReusableStringStream::operator<<(ReusableStringStream *this,char **value)

{
  char **value_local;
  ReusableStringStream *this_local;
  
  std::operator<<((ostream *)this->m_oss,*value);
  return this;
}

Assistant:

auto operator << ( T const& value ) -> ReusableStringStream& {
            *m_oss << value;
            return *this;
        }